

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

EventLogEntry * __thiscall TTD::EventLog::RecordEnqueueTaskEvent(EventLog *this,Var taskVar)

{
  EventLogEntry *pEVar1;
  ExternalCbRegisterCallEventLogEntry *local_20;
  ExternalCbRegisterCallEventLogEntry *ecEvent;
  
  local_20 = (ExternalCbRegisterCallEventLogEntry *)0x0;
  pEVar1 = RecordGetInitializedEvent<TTD::NSLogEvents::ExternalCbRegisterCallEventLogEntry,(TTD::NSLogEvents::EventKind)11>
                     (this,&local_20);
  local_20->CallbackFunction = taskVar;
  local_20->LastNestedEventTime = 0x7fffffffffffffff;
  return pEVar1;
}

Assistant:

NSLogEvents::EventLogEntry* EventLog::RecordEnqueueTaskEvent(Js::Var taskVar)
    {
        NSLogEvents::ExternalCbRegisterCallEventLogEntry* ecEvent = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::ExternalCbRegisterCallEventLogEntry, NSLogEvents::EventKind::ExternalCbRegisterCall>(&ecEvent);

        ecEvent->CallbackFunction = static_cast<TTDVar>(taskVar);
        ecEvent->LastNestedEventTime = TTD_EVENT_MAXTIME;

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteLiteralMsg("Enqueue Task: ");
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteVar(taskVar);
#endif

        return evt;
    }